

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O2

RESULT_TYPE __thiscall
duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
          (MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t> *this,
          INPUT_TYPE *input)

{
  int64_t iVar1;
  RESULT_TYPE RVar3;
  undefined1 auVar4 [12];
  int64_t iVar5;
  interval_t iVar2;
  
  iVar1 = timestamp_t::operator-(input,this->median);
  iVar1 = TryAbsOperator::Operation<long,long>(iVar1);
  iVar2 = Interval::FromMicro(iVar1);
  RVar3.months = iVar2.months;
  auVar4._4_4_ = iVar2.days;
  register0x00000010 = iVar2.micros;
  return RVar3;
}

Assistant:

inline RESULT_TYPE operator()(const INPUT_TYPE &input) const {
		const auto delta = input - median;
		return Interval::FromMicro(TryAbsOperator::Operation<int64_t, int64_t>(delta));
	}